

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O1

size_t __thiscall
MADPComponentDiscreteActions::ConstructJointActionsRecursively
          (MADPComponentDiscreteActions *this,Index curAgentI,JointActionDiscrete *ja,Index jaI)

{
  pointer *pppJVar1;
  ActionDiscrete *a;
  pointer pAVar2;
  pointer pvVar3;
  pointer pAVar4;
  pointer pAVar5;
  pointer puVar6;
  pointer puVar7;
  iterator __position;
  ulong uVar8;
  JointActionDiscrete *this_00;
  JointActionDiscrete *this_01;
  size_t sVar9;
  ostream *poVar10;
  undefined8 *puVar11;
  ulong uVar12;
  long lVar13;
  Index jaI_00;
  JointActionDiscrete *p_ja;
  JointActionDiscrete *local_1b8 [2];
  ostream local_1a8 [376];
  
  sVar9 = (size_t)jaI;
  uVar8 = (ulong)curAgentI;
  pvVar3 = (this->_m_actionVecs).
           super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((long)(this->_m_actionVecs).
                  super__Vector_base<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
           -0x5555555555555555;
  if (uVar12 < uVar8 || uVar12 - uVar8 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"ConstructJointActionsRecursively - current Agent index (",0x38);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,") out of bounds! (_m_actionVecs contains actions for ",0x35);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," agents...)\n",0xc);
    puVar11 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar11 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar11,&E::typeinfo,E::~E);
  }
  pAVar4 = pvVar3[uVar8].super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl
           .super__Vector_impl_data._M_start;
  pAVar5 = *(pointer *)
            ((long)&pvVar3[uVar8].
                    super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (pAVar4 != pAVar5) {
    puVar6 = (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar7 = (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this_00 = (JointActionDiscrete *)operator_new(0x48);
    JointActionDiscrete::JointActionDiscrete(this_00,ja);
    if (pAVar4 != pAVar5) {
      lVar13 = 0;
      do {
        a = (ActionDiscrete *)
            ((long)&(pAVar4->super_Action).super_NamedDescribedEntity._vptr_NamedDescribedEntity +
            lVar13);
        this_01 = ja;
        if ((lVar13 != 0) && (this_01 = this_00, a != pAVar5 + -1)) {
          this_01 = (JointActionDiscrete *)operator_new(0x48);
          JointActionDiscrete::JointActionDiscrete(this_01,this_00);
        }
        local_1b8[0] = this_01;
        jaI_00 = (Index)sVar9;
        if (((long)puVar6 - (long)puVar7 >> 3) - 1U == uVar8) {
          (local_1b8[0]->super_DiscreteEntity)._m_index = jaI_00;
          JointActionDiscrete::AddIndividualAction(local_1b8[0],a,curAgentI);
          __position._M_current =
               (this->_m_jointActionVec).
               super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->_m_jointActionVec).
              super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<JointActionDiscrete*,std::allocator<JointActionDiscrete*>>::
            _M_realloc_insert<JointActionDiscrete*const&>
                      ((vector<JointActionDiscrete*,std::allocator<JointActionDiscrete*>> *)
                       &this->_m_jointActionVec,__position,local_1b8);
          }
          else {
            *__position._M_current = local_1b8[0];
            pppJVar1 = &(this->_m_jointActionVec).
                        super__Vector_base<JointActionDiscrete_*,_std::allocator<JointActionDiscrete_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppJVar1 = *pppJVar1 + 1;
          }
          sVar9 = (size_t)(jaI_00 + 1);
        }
        else {
          JointActionDiscrete::AddIndividualAction(local_1b8[0],a,curAgentI);
          sVar9 = ConstructJointActionsRecursively(this,curAgentI + 1,local_1b8[0],jaI_00);
        }
        pAVar2 = (pointer)((long)&pAVar4[1].super_Action.super_NamedDescribedEntity.
                                  _vptr_NamedDescribedEntity + lVar13);
        lVar13 = lVar13 + 0x58;
      } while (pAVar2 != pAVar5);
    }
    return sVar9 & 0xffffffff;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"ERROR empty action set for agent ",0x21);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  puVar11 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar11 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar11,&E::typeinfo,E::~E);
}

Assistant:

size_t MADPComponentDiscreteActions::ConstructJointActionsRecursively(
    Index curAgentI, JointActionDiscrete& ja, Index jaI)
{

    bool lastAgent=false;
    if(curAgentI == _m_nrActions.size()-1)
    {
        lastAgent = true;    
    }
    if(curAgentI >= _m_actionVecs.size())
    {
        stringstream ss;
        ss << "ConstructJointActionsRecursively - current Agent index ("<<
            curAgentI<<") out of bounds! (_m_actionVecs contains actions for "<<
            _m_actionVecs.size() << " agents...)\n";
        throw E(ss);
    }

    ActionDVec::iterator first = _m_actionVecs[curAgentI].begin();
    ActionDVec::iterator it = _m_actionVecs[curAgentI].begin();
    ActionDVec::iterator last = _m_actionVecs[curAgentI].end();
    ActionDVec::iterator beforelast = _m_actionVecs[curAgentI].end();
    beforelast--;

    if(it == last)
    {
        stringstream ss; ss << "ERROR empty action set for agent " << curAgentI;
        throw E(ss);
    }
    //first action extends the received ja 
    JointActionDiscrete* p_jaReceivedArgCopy = new JointActionDiscrete(ja);
    JointActionDiscrete* p_ja;
        
    while( it != last) // other actions extend duplicates of ja
    {
        if(DEBUG_CJA)    cerr << "\nnext action";
            if(it == first) //
            {
                if(DEBUG_CJA)        
                    cerr << "(first action - not making copy)\n";
                p_ja = &ja;
            }
        else if (it == beforelast)//this is the last valid it -> last action   
        {
            if(DEBUG_CJA)        cerr << "(last action - not making copy)\n";
            p_ja = p_jaReceivedArgCopy; //don't make a new copy
        }
        else //make a new copy
        {        
            if(DEBUG_CJA) cerr << "(intermed. action - making copy)\n";
            p_ja = new JointActionDiscrete(*p_jaReceivedArgCopy);    
        }    
        if(lastAgent)
        {
            p_ja->SetIndex(jaI);
            if(DEBUG_CJA)cerr << "setting index of this joint action to: "
                << jaI <<endl;
        }
        ActionDiscrete* ai = /*(ActionDiscrete*)*/ &(*it);
        if(DEBUG_CJA)cerr <<"Adding agent's indiv. action to joint action..."
            <<endl;
        p_ja->AddIndividualAction(ai, curAgentI);
        
        if(lastAgent) //jointAction is now completed: add it to jointAction set.
        {
            if(DEBUG_CJA){cerr << "INSERTING the joint action:"; 
                p_ja->Print();cerr<<endl;}
            _m_jointActionVec.push_back(p_ja);
            if(DEBUG_CJA){cerr << "\nINSERTED the joint action."<<endl;
                cerr << "_m_jointActionVec now containts "<< 
                _m_jointActionVec.size() << " joint actions." << endl;}
            jaI++;
        }
        else
            jaI = ConstructJointActionsRecursively(curAgentI+1,*p_ja, jaI);
        
        it++;
    }
    if(DEBUG_CJA)    
        cerr << ">>ProblemDecTiger::ConstructJointActionsRecursively(Index "<<
            curAgentI<<", JointActionDiscrete& ja, Index "<< jaI<<") FINISHED"
            <<endl;
    return jaI;
}